

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O2

void __thiscall
embree::ISPCTriangleMesh::ISPCTriangleMesh
          (ISPCTriangleMesh *this,RTCDevice device,uint numTriangles,uint numVertices,
          bool hasNormals,bool hasTexcoords,uint numTimeSteps)

{
  RTCGeometry pRVar1;
  Vec3fa **ppVVar2;
  Vec3fa *pVVar3;
  Vec2f *pVVar4;
  ISPCTriangle *pIVar5;
  size_t i;
  ulong uVar6;
  size_t size;
  ulong uVar7;
  
  (this->geom).type = TRIANGLE_MESH;
  (this->geom).geometry = (RTCGeometry)0x0;
  (this->geom).materialID = 0xffffffff;
  (this->geom).visited = false;
  this->positions = (Vec3fa **)0x0;
  this->normals = (Vec3fa **)0x0;
  this->texcoords = (Vec2f *)0x0;
  this->triangles = (ISPCTriangle *)0x0;
  this->startTime = 0.0;
  this->endTime = 1.0;
  this->numTimeSteps = numTimeSteps;
  this->numVertices = numVertices;
  this->numTriangles = numTriangles;
  pRVar1 = (RTCGeometry)rtcNewGeometry(device,0);
  (this->geom).geometry = pRVar1;
  uVar7 = (ulong)numTimeSteps;
  ppVVar2 = (Vec3fa **)alignedUSMMalloc(uVar7 * 8,0x10,DEVICE_READ_ONLY);
  this->positions = ppVVar2;
  size = (ulong)numVertices << 4;
  for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    pVVar3 = (Vec3fa *)alignedUSMMalloc(size,0x10,DEVICE_READ_ONLY);
    this->positions[uVar6] = pVVar3;
  }
  if (hasNormals) {
    ppVVar2 = (Vec3fa **)alignedUSMMalloc(uVar7 * 8,0x10,DEVICE_READ_ONLY);
    this->normals = ppVVar2;
    for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
      pVVar3 = (Vec3fa *)alignedUSMMalloc(size,0x10,DEVICE_READ_ONLY);
      this->normals[uVar6] = pVVar3;
    }
  }
  if (hasTexcoords) {
    pVVar4 = (Vec2f *)alignedUSMMalloc((ulong)numVertices << 3,0x10,DEVICE_READ_ONLY);
    this->texcoords = pVVar4;
  }
  pIVar5 = (ISPCTriangle *)alignedUSMMalloc((ulong)numTriangles * 0xc,0x10,DEVICE_READ_ONLY);
  this->triangles = pIVar5;
  return;
}

Assistant:

ISPCTriangleMesh::ISPCTriangleMesh (RTCDevice device, unsigned int numTriangles, unsigned int numVertices, bool hasNormals, bool hasTexcoords, unsigned int numTimeSteps)
    : geom(TRIANGLE_MESH),
      positions(nullptr), normals(nullptr), texcoords(nullptr), triangles(nullptr), startTime(0.0f), endTime(1.0f),
      numTimeSteps(numTimeSteps), numVertices(numVertices), numTriangles(numTriangles)
  {
    assert(numTimeSteps);

    geom.geometry = rtcNewGeometry (device, RTC_GEOMETRY_TYPE_TRIANGLE);
    
    positions = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*numTimeSteps);
    for (size_t i=0; i<numTimeSteps; i++)
      positions[i] = (Vec3fa*) alignedUSMMalloc(sizeof(Vec3fa)*numVertices);

    if (hasNormals) {
      normals = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*numTimeSteps);
      for (size_t i=0; i<numTimeSteps; i++)
        normals[i] = (Vec3fa*) alignedUSMMalloc(sizeof(Vec3fa)*numVertices);
    }

    if (hasTexcoords)
      texcoords = (Vec2f*) alignedUSMMalloc(sizeof(Vec2f)*numVertices);

    triangles = (ISPCTriangle*) alignedUSMMalloc(sizeof(ISPCTriangle)*numTriangles);
  }